

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopologyException.cpp
# Opt level: O2

void __thiscall MeshLib::TopologyException::what(TopologyException *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,this->msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
TopologyException::what()
{
	std::cout << msg << std::endl;
}